

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

TiXmlElement * __thiscall TiXmlNode::FirstChildElement(TiXmlNode *this,char *_value)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TiXmlNode *pTVar2;
  
  pTVar2 = this->firstChild;
  while( true ) {
    if (pTVar2 == (TiXmlNode *)0x0) {
      return (TiXmlElement *)0x0;
    }
    iVar1 = strcmp(((pTVar2->value).rep_)->str,_value);
    if (iVar1 == 0) break;
    pTVar2 = pTVar2->next;
  }
  do {
    iVar1 = (*(pTVar2->super_TiXmlBase)._vptr_TiXmlBase[5])(pTVar2);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      iVar1 = (*(pTVar2->super_TiXmlBase)._vptr_TiXmlBase[5])(pTVar2);
      return (TiXmlElement *)CONCAT44(extraout_var_00,iVar1);
    }
    do {
      pTVar2 = pTVar2->next;
      if (pTVar2 == (TiXmlNode *)0x0) {
        return (TiXmlElement *)0x0;
      }
      iVar1 = strcmp(((pTVar2->value).rep_)->str,_value);
    } while (iVar1 != 0);
  } while( true );
}

Assistant:

const TiXmlNode* TiXmlNode::FirstChild( const char * _value ) const
{
	const TiXmlNode* node;
	for ( node = firstChild; node; node = node->next )
	{
		if ( strcmp( node->Value(), _value ) == 0 )
			return node;
	}
	return 0;
}